

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation.cpp
# Opt level: O2

void __thiscall
CheckValidRepresentationOfFlexfloat5_10_regular_Test::
~CheckValidRepresentationOfFlexfloat5_10_regular_Test
          (CheckValidRepresentationOfFlexfloat5_10_regular_Test *this)

{
  ~CheckValidRepresentationOfFlexfloat5_10_regular_Test
            ((CheckValidRepresentationOfFlexfloat5_10_regular_Test *)
             &this[-1].super_CheckValidRepresentationOfFlexfloat5_10.
              super_TestWithParam<std::tuple<unsigned_short,_unsigned_short>_>.super_Test.
              gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(CheckValidRepresentationOfFlexfloat5_10, regular)
{
    uint16_t const e = std::get<0>(GetParam());
    uint16_t const m = std::get<1>(GetParam());

    IEEEHelper h = IEEEHelper(e, m);
    // h.showConfig();
    // printf("Normal Range:\n");

    int ne = h.countExpRange();
    int nm = h.countSubnormalRange();

    for (int ie = 0; ie < ne; ++ie) {
        for (int im = 0; im < nm; ++im) {
            double d = h.iterateNormalRange(ie, im);
            test<flexfloat<5, 10>>(d);
        }
    }
}